

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O2

ProStringList * __thiscall
QMakeEvaluator::split_value_list
          (ProStringList *__return_storage_ptr__,QMakeEvaluator *this,QStringView vals,int source)

{
  int iVar1;
  storage_type_conflict sVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  QChar QVar6;
  storage_type_conflict sVar7;
  long in_FS_OFFSET;
  int local_9c;
  ProString local_88;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  local_58.size = 0;
  (__return_storage_ptr__->super_QList<ProString>).d.d = (Data *)0x0;
  (__return_storage_ptr__->super_QList<ProString>).d.ptr = (ProString *)0x0;
  (__return_storage_ptr__->super_QList<ProString>).d.size = 0;
  local_9c = source;
  if (source == 0) {
    local_9c = currentFileId(this);
  }
  sVar7 = L'\0';
  bVar3 = false;
  iVar5 = 0;
  do {
    if ((int)vals.m_size <= iVar5) {
      if (bVar3) {
        ProString::ProString(&local_88,(QString *)&local_58);
        local_88.m_file = local_9c;
        QList<ProString>::emplaceBack<ProString_const&>
                  (&__return_storage_ptr__->super_QList<ProString>,&local_88);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return __return_storage_ptr__;
    }
    sVar2 = vals.m_data[iVar5];
    QVar6.ucs = (char16_t)&local_58;
    if (sVar2 == sVar7) {
      QString::append(QVar6);
      bVar3 = true;
LAB_001f4dc3:
      sVar7 = L'\0';
    }
    else if ((sVar2 == L'\t') || (sVar2 == L' ')) {
      if (sVar7 != L'\0') goto LAB_001f4e99;
      if (!bVar3) goto LAB_001f4dc3;
      ProString::ProString(&local_88,(QString *)&local_58);
      local_88.m_file = local_9c;
      QList<ProString>::emplaceBack<ProString_const&>
                (&__return_storage_ptr__->super_QList<ProString>,&local_88);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
      QString::clear((QString *)&local_58);
      sVar7 = L'\0';
      bVar3 = false;
    }
    else {
      bVar3 = true;
      if (sVar2 == L'\"') {
LAB_001f4ded:
        if (sVar7 == L'\0') {
          sVar7 = sVar2;
        }
      }
      else if (sVar2 == L'\\') {
        iVar1 = iVar5 + 1;
        if (((iVar1 != (int)vals.m_size) &&
            (uVar4 = (ushort)vals.m_data[iVar1] - 0x22, uVar4 < 0x3b)) &&
           ((0x400000000000021U >> ((ulong)uVar4 & 0x3f) & 1) != 0)) {
          QString::append(QVar6);
          iVar5 = iVar1;
        }
      }
      else if (sVar2 == L'\'') goto LAB_001f4ded;
LAB_001f4e99:
      QString::append((QChar)(char16_t)&local_58);
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

ProStringList QMakeEvaluator::split_value_list(QStringView vals, int source)
{
    QString build;
    ProStringList ret;

    if (!source)
        source = currentFileId();

    const QChar *vals_data = vals.data();
    const int vals_len = vals.size();
    char16_t quote = 0;
    bool hadWord = false;
    for (int x = 0; x < vals_len; x++) {
        char16_t unicode = vals_data[x].unicode();
        if (unicode == quote) {
            quote = 0;
            hadWord = true;
            build += QChar(unicode);
            continue;
        }
        switch (unicode) {
        case '"':
        case '\'':
            if (!quote)
                quote = unicode;
            // FIXME: this is inconsistent with the "there are no empty strings" dogma.
            hadWord = true;
            break;
        case ' ':
        case '\t':
            if (!quote) {
                if (hadWord) {
                    ret << ProString(build).setSource(source);
                    build.clear();
                    hadWord = false;
                }
                continue;
            }
            break;
        case '\\':
            if (x + 1 != vals_len) {
                char16_t next = vals_data[++x].unicode();
                if (next == '\'' || next == '"' || next == '\\') {
                    build += QChar(unicode);
                    unicode = next;
                } else {
                    --x;
                }
            }
            Q_FALLTHROUGH();
        default:
            hadWord = true;
            break;
        }
        build += QChar(unicode);
    }
    if (hadWord)
        ret << ProString(build).setSource(source);
    return ret;
}